

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.hpp
# Opt level: O3

ray<double> * __thiscall
camera<double>::getRay(ray<double> *__return_storage_ptr__,camera<double> *this,double *s,double *t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  int iVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  do {
    iVar15 = rand();
    dVar20 = (double)iVar15 * 4.656612873077393e-10 + (double)iVar15 * 4.656612873077393e-10 + -1.0;
    iVar15 = rand();
    dVar16 = (double)iVar15 * 4.656612873077393e-10 + (double)iVar15 * 4.656612873077393e-10 + -1.0;
  } while (1.0 <= dVar20 * dVar20 + dVar16 * dVar16);
  dVar20 = dVar20 * this->r_;
  dVar16 = dVar16 * this->r_;
  dVar19 = (this->v).e[2] * dVar16 + (this->u).e[2] * dVar20;
  dVar1 = (this->o_).e[2];
  dVar2 = *s;
  dVar3 = (this->hor_).e[2];
  dVar4 = (this->llc_).e[2];
  dVar5 = *t;
  dVar6 = (this->ver_).e[2];
  dVar7 = this->t0_;
  dVar8 = this->t1_;
  dVar17 = dVar16 * (this->v).e[0] + dVar20 * (this->u).e[0];
  dVar18 = dVar16 * (this->v).e[1] + dVar20 * (this->u).e[1];
  dVar20 = (this->o_).e[0];
  dVar16 = (this->o_).e[1];
  dVar9 = (this->hor_).e[0];
  dVar10 = (this->hor_).e[1];
  dVar11 = (this->llc_).e[0];
  dVar12 = (this->llc_).e[1];
  dVar13 = (this->ver_).e[0];
  dVar14 = (this->ver_).e[1];
  iVar15 = rand();
  (__return_storage_ptr__->o_).e[0] = dVar17 + dVar20;
  (__return_storage_ptr__->o_).e[1] = dVar18 + dVar16;
  (__return_storage_ptr__->o_).e[2] = dVar19 + dVar1;
  (__return_storage_ptr__->dir_).e[0] =
       ((dVar5 * dVar13 + dVar11 + dVar2 * dVar9) - dVar20) - dVar17;
  (__return_storage_ptr__->dir_).e[1] =
       ((dVar5 * dVar14 + dVar12 + dVar2 * dVar10) - dVar16) - dVar18;
  (__return_storage_ptr__->dir_).e[2] = ((dVar6 * dVar5 + dVar3 * dVar2 + dVar4) - dVar1) - dVar19;
  __return_storage_ptr__->time_ = (double)iVar15 * 4.656612873077393e-10 * (dVar8 - dVar7) + dVar7;
  return __return_storage_ptr__;
}

Assistant:

ray<T> getRay(const T& s, const T& t) const {
    vec3<T> rd = r_ * random_disk_hat<T>();
    vec3<T> off = u * rd.getX() + v * rd.getY();

    return ray<T>(o_ + off, llc_ + s * hor_ + t * ver_ - o_ - off,
                  random_double(t0_, t1_));
    // return ray<T>(o_, llc_ + s * hor_ + t * ver_ - o_);
  }